

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

rx_status rx__dyn_array_ensure_has_enough_capacity
                    (void **block,size_t current_capacity,size_t requested_capacity,
                    size_t max_capacity,size_t element_size)

{
  ulong local_48;
  size_t new_capacity;
  void *buf;
  size_t element_size_local;
  size_t max_capacity_local;
  size_t requested_capacity_local;
  size_t current_capacity_local;
  void **block_local;
  
  buf = (void *)element_size;
  element_size_local = max_capacity;
  max_capacity_local = requested_capacity;
  requested_capacity_local = current_capacity;
  current_capacity_local = (size_t)block;
  if (block == (void **)0x0) {
    __assert_fail("block != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x11de,
                  "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                 );
  }
  if (element_size == 0) {
    __assert_fail("element_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x11df,
                  "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                 );
  }
  if (max_capacity < requested_capacity) {
    rx__log(RX_LOG_LEVEL_ALL,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
            ,0x11e2,"the requested capacity is too large\n");
    block_local._4_4_ = RX_ERROR_MAX_SIZE_EXCEEDED;
  }
  else if ((*block == (void *)0x0) || (current_capacity < requested_capacity)) {
    rx__dyn_array_get_new_capacity(&local_48,current_capacity,requested_capacity,max_capacity);
    if (local_48 < max_capacity_local) {
      __assert_fail("new_capacity >= requested_capacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x11ec,
                    "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                   );
    }
    if (element_size_local < local_48) {
      __assert_fail("new_capacity <= max_capacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x11ed,
                    "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                   );
    }
    new_capacity = (size_t)realloc(*(void **)current_capacity_local,(long)buf * local_48 + 0x10);
    if ((void *)new_capacity == (void *)0x0) {
      rx__log(RX_LOG_LEVEL_ALL,
              "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
              ,0x11f3,"failed to reallocate the block\n");
      block_local._4_4_ = RX_ERROR_ALLOCATION;
    }
    else {
      *(ulong *)(new_capacity + 8) = local_48;
      *(size_t *)current_capacity_local = new_capacity;
      block_local._4_4_ = RX_SUCCESS;
    }
  }
  else {
    block_local._4_4_ = RX_SUCCESS;
  }
  return block_local._4_4_;
}

Assistant:

static enum rx_status
rx__dyn_array_ensure_has_enough_capacity(void **block,
                                         size_t current_capacity,
                                         size_t requested_capacity,
                                         size_t max_capacity,
                                         size_t element_size)
{
    void *buf;
    size_t new_capacity;

    RX_ASSERT(block != NULL);
    RX_ASSERT(element_size > 0);

    if (requested_capacity > max_capacity) {
        RX__LOG_DEBUG("the requested capacity is too large\n");
        return RX_ERROR_MAX_SIZE_EXCEEDED;
    }

    if (*block != NULL && current_capacity >= requested_capacity) {
        return RX_SUCCESS;
    }

    rx__dyn_array_get_new_capacity(
        &new_capacity, current_capacity, requested_capacity, max_capacity);
    RX_ASSERT(new_capacity >= requested_capacity);
    RX_ASSERT(new_capacity <= max_capacity);

    buf = RX_REALLOC(
        *block,
        sizeof(struct rx__dyn_array_header) + element_size * new_capacity);
    if (buf == NULL) {
        RX__LOG_DEBUG("failed to reallocate the block\n");
        return RX_ERROR_ALLOCATION;
    }

    RX__DYN_ARRAY_GET_HEADER(buf)->capacity = new_capacity;
    *block = buf;
    return RX_SUCCESS;
}